

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddTargetItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  size_type sVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  const_iterator cVar5;
  string *psVar6;
  size_t sVar7;
  const_iterator cVar8;
  FeatureDescriptor *pFVar9;
  pointer pcVar10;
  char *__s;
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  cmGeneratorTarget *target;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  cmGeneratorTarget *local_138;
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined8 local_f0;
  char *local_e8;
  size_type local_e0;
  pointer local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [96];
  bool local_60;
  FeatureDescriptor *local_58;
  undefined1 *local_50;
  undefined1 local_48 [32];
  
  this_00 = entry->Target;
  local_138 = this_00;
  TVar3 = cmGeneratorTarget::GetType(this_00);
  if (TVar3 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar3 = cmGeneratorTarget::GetType(this_00);
  if (TVar3 == SHARED_LIBRARY) {
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*const&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)&this->SharedLibrariesLinked,&local_138);
  }
  if ((this->NoSONameUsesPath == true) &&
     (bVar2 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(local_138,&this->Config), bVar2))
  {
    AddSharedLibNoSOName(this,entry);
    return;
  }
  if ((this->OldLinkDirMode == true) &&
     (bVar2 = cmGeneratorTarget::IsFrameworkOnApple(local_138), !bVar2)) {
    cmsys::SystemTools::GetFilenamePath((string *)local_c0,(string *)entry);
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->OldLinkDirMask)._M_t,(string *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    if ((_Rb_tree_header *)cVar5._M_node ==
        &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,(value_type *)entry);
    }
  }
  bVar2 = cmGeneratorTarget::IsFrameworkOnApple(local_138);
  if ((!bVar2) ||
     (iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])(), (char)iVar4 != '\0')) {
    local_58 = (FeatureDescriptor *)CONCAT44(local_58._4_4_,1);
    sVar7 = (entry->Feature)._M_string_length;
    if (sVar7 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
      if (sVar7 != 0) {
        pcVar10 = (entry->Feature)._M_dataplus._M_p;
        iVar4 = bcmp(pcVar10,cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                     sVar7);
        if (iVar4 != 0) goto LAB_00439f4b;
      }
      bVar2 = cmGeneratorTarget::IsFrameworkOnApple(local_138);
      if (bVar2) {
        iVar4 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
        __s = "__CMAKE_LINK_LIBRARY";
        if ((char)iVar4 != '\0') {
          __s = "__CMAKE_LINK_FRAMEWORK";
        }
      }
      else {
        __s = "__CMAKE_LINK_LIBRARY";
      }
      local_c0._0_8_ = local_c0 + 0x10;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,__s,__s + sVar7);
    }
    else {
      pcVar10 = (entry->Feature)._M_dataplus._M_p;
LAB_00439f4b:
      local_c0._0_8_ = local_c0 + 0x10;
      std::__cxx11::string::_M_construct<char*>((string *)local_c0,pcVar10,pcVar10 + sVar7);
    }
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_c0);
    local_110._0_8_ = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar8._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_110._0_8_ = (FeatureDescriptor *)(cVar8._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&entry->Item,(ItemIsPath *)&local_58,&local_138,
               (FeatureDescriptor **)local_110);
    if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
      return;
    }
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    return;
  }
  cmGlobalGenerator::SplitFrameworkPath
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_c0,this->GlobalGenerator,
             (string *)entry,Extended);
  if (local_60 == false) {
    this_01 = this->CMakeInstance;
    pcVar10 = (entry->Item).Value._M_dataplus._M_p;
    sVar1 = (entry->Item).Value._M_string_length;
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_110._0_8_ = (FeatureDescriptor *)0x20;
    local_110._8_8_ = "Could not parse framework path \"";
    local_f0 = 0x13;
    local_e8 = "\" linked by target ";
    local_d8 = (psVar6->_M_dataplus)._M_p;
    local_e0 = psVar6->_M_string_length;
    local_c8 = local_48;
    local_58 = (FeatureDescriptor *)0x1;
    local_48[0] = 0x2e;
    local_d0 = 1;
    views._M_len = 5;
    views._M_array = (iterator)local_110;
    local_110._16_8_ = sVar1;
    local_110._24_8_ = pcVar10;
    local_50 = local_c8;
    cmCatViews_abi_cxx11_((string *)local_130,views);
    cmake::IssueMessage(this_01,FATAL_ERROR,(string *)local_130,&(entry->Item).Backtrace);
    pFVar9 = (FeatureDescriptor *)CONCAT44(local_130._4_4_,local_130._0_4_);
    if ((FeatureDescriptor *)CONCAT44(local_130._4_4_,local_130._0_4_) ==
        (FeatureDescriptor *)(local_130 + 0x10)) goto LAB_0043a241;
  }
  else {
    if ((local_c0._8_8_ != 0) &&
       (pVar11 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&this->FrameworkPathsEmitted,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0),
       ((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->FrameworkPaths,(value_type *)local_c0);
    }
    psVar6 = &entry->Feature;
    local_110._8_8_ = (entry->Feature)._M_dataplus._M_p;
    pFVar9 = (FeatureDescriptor *)(entry->Feature)._M_string_length;
    local_110._0_8_ = pFVar9;
    if (pFVar9 < (FeatureDescriptor *)0x9) {
LAB_0043a00f:
      local_130._0_4_ = Yes;
      if (pFVar9 == (FeatureDescriptor *)
                    cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
        if (pFVar9 != (FeatureDescriptor *)0x0) {
          pcVar10 = (psVar6->_M_dataplus)._M_p;
          iVar4 = bcmp(pcVar10,cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                       (size_t)pFVar9);
          if (iVar4 != 0) goto LAB_0043a1c7;
        }
        local_110._0_8_ = local_110 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"__CMAKE_LINK_LIBRARY","");
      }
      else {
        pcVar10 = (psVar6->_M_dataplus)._M_p;
LAB_0043a1c7:
        local_110._0_8_ = local_110 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,pcVar10,pcVar10 + (long)&(pFVar9->Name)._M_dataplus);
      }
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
              ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_110);
      local_58 = (FeatureDescriptor *)0x0;
      if ((_Rb_tree_header *)cVar8._M_node !=
          &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
        local_58 = (FeatureDescriptor *)(cVar8._M_node + 2);
      }
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&entry->Item,(ItemIsPath *)local_130,&local_138,&local_58);
    }
    else {
      __str._M_str = "FRAMEWORK";
      __str._M_len = 9;
      iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_110,
                         (size_type)((long)&pFVar9[-1].ItemNameFormat.field_2 + 7),9,__str);
      if (iVar4 != 0) {
        pFVar9 = (FeatureDescriptor *)(entry->Feature)._M_string_length;
        goto LAB_0043a00f;
      }
      cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
                ((string *)local_110,(FrameworkDescriptor *)local_c0);
      local_130._0_4_ = Yes;
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
              ::find(&(this->LibraryFeatureDescriptors)._M_t,psVar6);
      local_58 = (FeatureDescriptor *)0x0;
      if ((_Rb_tree_header *)cVar8._M_node !=
          &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
        local_58 = (FeatureDescriptor *)(cVar8._M_node + 2);
      }
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,(ItemIsPath *)local_130,&local_138,&local_58);
    }
    local_130._16_8_ = local_110._16_8_;
    pFVar9 = (FeatureDescriptor *)local_110._0_8_;
    if ((FeatureDescriptor *)local_110._0_8_ == (FeatureDescriptor *)(local_110 + 0x10))
    goto LAB_0043a241;
  }
  operator_delete(pFVar9,local_130._16_8_ + 1);
LAB_0043a241:
  if (local_60 == true) {
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_destroy
              ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)local_c0);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(LinkEntry const& entry)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  BT<std::string> const& item = entry.Item;
  cmGeneratorTarget const* target = entry.Target;

  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(entry);
    return;
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      !cm::contains(this->OldLinkDirMask,
                    cmSystemTools::GetFilenamePath(item.Value))) {
    this->OldLinkDirItems.push_back(item.Value);
  }

  if (target->IsFrameworkOnApple() && !this->GlobalGenerator->IsXcode()) {
    // Add the framework directory and the framework item itself
    auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
      item.Value, cmGlobalGenerator::FrameworkFormat::Extended);
    if (!fwDescriptor) {
      this->CMakeInstance->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Could not parse framework path \"", item.Value,
                 "\" linked by target ", this->Target->GetName(), '.'),
        item.Backtrace);
      return;
    }
    if (!fwDescriptor->Directory.empty()) {
      // Add the directory portion to the framework search path.
      this->AddFrameworkPath(fwDescriptor->Directory);
    }
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s)) {
      this->Items.emplace_back(fwDescriptor->GetLinkName(), ItemIsPath::Yes,
                               target,
                               this->FindLibraryFeature(entry.Feature));
    } else {
      this->Items.emplace_back(
        item, ItemIsPath::Yes, target,
        this->FindLibraryFeature(
          entry.Feature == DEFAULT ? "__CMAKE_LINK_LIBRARY" : entry.Feature));
    }
  } else {
    // Now add the full path to the library.
    this->Items.emplace_back(
      item, ItemIsPath::Yes, target,
      this->FindLibraryFeature(
        entry.Feature == DEFAULT
          ? (target->IsFrameworkOnApple() && this->GlobalGenerator->IsXcode()
               ? "__CMAKE_LINK_FRAMEWORK"
               : "__CMAKE_LINK_LIBRARY")
          : entry.Feature));
  }
}